

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *X_00;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int result_is_zero;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  size_t j;
  size_t i;
  int ret;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar1;
  mbedtls_mpi *in_stack_ffffffffffffffb0;
  mbedtls_mpi *in_stack_ffffffffffffffb8;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc0;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc8;
  ulong local_28;
  int local_1c;
  long *local_18;
  long *local_10;
  
  iVar1 = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffc0);
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffb0);
  local_10 = in_RSI;
  if (in_RDI == in_RSI) {
    local_1c = mbedtls_mpi_copy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (local_1c != 0) goto LAB_0086d097;
    local_10 = (long *)&stack0xffffffffffffffc0;
  }
  local_18 = in_RDX;
  if (in_RDI == in_RDX) {
    local_1c = mbedtls_mpi_copy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (local_1c != 0) goto LAB_0086d097;
    local_18 = (long *)&stack0xffffffffffffffb0;
  }
  local_28 = (ulong)*(ushort *)((long)local_10 + 10);
  while ((local_28 != 0 && (*(long *)(*local_10 + (local_28 - 1) * 8) == 0))) {
    local_28 = local_28 - 1;
  }
  if (local_28 == 0) {
    iVar1 = 1;
  }
  X_00 = (mbedtls_mpi_uint *)(ulong)*(ushort *)((long)local_18 + 10);
  while ((X_00 != (mbedtls_mpi_uint *)0x0 && (*(long *)(*local_18 + ((long)X_00 - 1U) * 8) == 0))) {
    X_00 = (mbedtls_mpi_uint *)((long)X_00 - 1);
  }
  if (X_00 == (mbedtls_mpi_uint *)0x0) {
    iVar1 = 1;
  }
  local_1c = mbedtls_mpi_grow(in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
  if ((local_1c == 0) &&
     (local_1c = mbedtls_mpi_lset(in_stack_ffffffffffffffb0,
                                  CONCAT44(iVar1,in_stack_ffffffffffffffa8)), local_1c == 0)) {
    mbedtls_mpi_core_mul
              (X_00,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
               (mbedtls_mpi_uint *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
    if (iVar1 == 0) {
      *(short *)(in_RDI + 1) = (short)local_10[1] * (short)local_18[1];
    }
    else {
      *(undefined2 *)(in_RDI + 1) = 1;
    }
  }
LAB_0086d097:
  mbedtls_mpi_free((mbedtls_mpi *)0x86d0a1);
  mbedtls_mpi_free((mbedtls_mpi *)0x86d0ab);
  return local_1c;
}

Assistant:

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    int result_is_zero = 0;

    mbedtls_mpi_init(&TA);
    mbedtls_mpi_init(&TB);

    if (X == A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A)); A = &TA;
    }
    if (X == B) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B)); B = &TB;
    }

    for (i = A->n; i > 0; i--) {
        if (A->p[i - 1] != 0) {
            break;
        }
    }
    if (i == 0) {
        result_is_zero = 1;
    }

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }
    if (j == 0) {
        result_is_zero = 1;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i + j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

    mbedtls_mpi_core_mul(X->p, A->p, i, B->p, j);

    /* If the result is 0, we don't shortcut the operation, which reduces
     * but does not eliminate side channels leaking the zero-ness. We do
     * need to take care to set the sign bit properly since the library does
     * not fully support an MPI object with a value of 0 and s == -1. */
    if (result_is_zero) {
        X->s = 1;
    } else {
        X->s = A->s * B->s;
    }

cleanup:

    mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TA);

    return ret;
}